

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O0

void drinksink(void)

{
  schar sVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  monst *pmVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  char *local_48;
  bool local_3c;
  bool local_3b;
  byte local_3a;
  byte local_39;
  char *local_38;
  char *local_30;
  monst *mtmp;
  obj *otmp;
  
  if (((u.uprops[0x12].intrinsic != 0) || (u.uprops[0x12].extrinsic != 0)) ||
     ((youmonst.data)->mlet == '\x05')) {
    floating_above("sink");
    return;
  }
  iVar3 = rn2(0x14);
  switch(iVar3) {
  case 0:
    pline("You take a sip of very cold water.");
    break;
  case 1:
    pline("You take a sip of very warm water.");
    break;
  case 2:
    pline("You take a sip of scalding hot water.");
    if ((((u.uprops[1].intrinsic == 0) && (u.uprops[1].extrinsic == 0)) &&
        ((youmonst.mintrinsics & 1) == 0)) ||
       (((((u.uprops[1].intrinsic & 0x4000000) != 0 && ((u.uprops[1].intrinsic & 0xfbffffff) == 0))
         && (u.uprops[1].extrinsic == 0)) && ((youmonst.mintrinsics & 1) == 0)))) {
      bVar8 = false;
      if ((((u.uprops[1].intrinsic & 0x4000000) != 0) &&
          (bVar8 = false, (u.uprops[1].intrinsic & 0xfbffffff) == 0)) &&
         (bVar8 = false, u.uprops[1].extrinsic == 0)) {
        bVar8 = (youmonst.mintrinsics & 1) == 0;
      }
      iVar3 = 6;
      if (bVar8) {
        iVar3 = 3;
      }
      iVar3 = rnd(iVar3);
      losehp(iVar3,"sipping boiling water",1);
    }
    else {
      pline("It seems quite tasty.");
    }
    break;
  case 3:
    if ((mvitals[0x5a].mvflags & 3) != 0) {
      pline("The sink seems quite dirty.");
      return;
    }
    pmVar5 = makemon(mons + 0x5a,level,(int)u.ux,(int)u.uy,0);
    if (pmVar5 == (monst *)0x0) {
      return;
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if (pmVar5->wormno == '\0') {
        if (((viz_array[pmVar5->my][pmVar5->mx] & 2U) != 0) ||
           ((((((u.uprops[0x1e].intrinsic == 0 &&
                ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             ((u.uprops[0x40].intrinsic != 0 ||
              ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
            (((pmVar5->data->mflags3 & 0x200) != 0 &&
             ((viz_array[pmVar5->my][pmVar5->mx] & 1U) != 0)))))) goto LAB_001dfb12;
LAB_001dfb9f:
        if (((((pmVar5->data->mflags1 & 0x10000) != 0) ||
             ((poVar4 = which_armor(pmVar5,4), poVar4 != (obj *)0x0 &&
              (poVar4 = which_armor(pmVar5,4), poVar4->otyp == 0x4f)))) ||
            (((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
              (((((u.uprops[0x19].intrinsic == 0 &&
                  ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                 (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
               (u.uprops[0x19].blocked != 0)))) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
              (iVar3 = dist2((int)pmVar5->mx,(int)pmVar5->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))
            ) && (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                  (bVar2 = match_warn_of_mon(pmVar5), bVar2 == '\0')))) goto LAB_001dfd62;
      }
      else {
        bVar2 = worm_known(level,pmVar5);
        if (bVar2 == '\0') goto LAB_001dfb9f;
LAB_001dfb12:
        if ((((((*(uint *)&pmVar5->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
           ((((*(uint *)&pmVar5->field_0x60 >> 7 & 1) != 0 ||
             ((*(uint *)&pmVar5->field_0x60 >> 9 & 1) != 0)) || (((byte)u._1052_1_ >> 5 & 1) != 0)))
           ) goto LAB_001dfb9f;
      }
      local_30 = a_monnam(pmVar5);
    }
    else {
LAB_001dfd62:
      local_30 = "something squirmy";
    }
    pline("Eek!  There\'s %s in the sink!",local_30);
    break;
  case 4:
    do {
      mtmp = (monst *)mkobj(level,'\b','\0');
      if (*(short *)((long)&mtmp->m_id + 2) == 0x14f) {
        obfree((obj *)mtmp,(obj *)0x0);
        mtmp = (monst *)0x0;
      }
    } while (mtmp == (monst *)0x0);
    *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffffd;
    *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xfffffffe;
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      local_38 = hcolor(obj_descr[objects[*(short *)((long)&mtmp->m_id + 2)].oc_descr_idx].oc_descr)
      ;
    }
    else {
      local_38 = "odd";
    }
    pline("Some %s liquid flows from the faucet.",local_38);
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((local_39 = 1, ublindf != (obj *)0x0 && (local_39 = 1, ublindf->oartifact == '\x1d')))) {
      local_3a = 0;
      if (u.uprops[0x23].intrinsic != 0) {
        local_3b = true;
        if (u.uprops[0x24].extrinsic == 0) {
          local_3c = false;
          if (u.umonnum != u.umonster) {
            bVar2 = dmgtype(youmonst.data,0x24);
            local_3c = bVar2 != '\0';
          }
          local_3b = local_3c;
        }
        local_3a = local_3b ^ 0xff;
      }
      local_39 = local_3a;
    }
    *(uint *)(mtmp->mtrack + 3) =
         *(uint *)(mtmp->mtrack + 3) & 0xffffffdf | (uint)((local_39 ^ 0xff) & 1) << 5;
    mtmp->mhpmax = mtmp->mhpmax + 1;
    mtmp->my = '\x01';
    mtmp->mux = '\0';
    mtmp->muy = '\0';
    mtmp->malign = '\0';
    dopotion((obj *)mtmp);
    obfree((obj *)mtmp,(obj *)0x0);
    break;
  case 5:
    if ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 4) == 0) {
      pline("You find a ring in the sink!");
      mkobj_at('\x04',level,(int)u.ux,(int)u.uy,'\x01');
      lVar6 = (long)u.ux;
      lVar7 = (long)u.uy;
      *(uint *)&level->locations[lVar6][lVar7].field_0x6 =
           *(uint *)&level->locations[lVar6][lVar7].field_0x6 & 0xfffffe0f |
           (*(uint *)&level->locations[lVar6][lVar7].field_0x6 >> 4 & 0x1f | 4) << 4;
      exercise(2,'\x01');
      newsym((int)u.ux,(int)u.uy);
    }
    else {
      pline("Some dirty water backs up in the drain.");
    }
    break;
  case 6:
    breaksink((int)u.ux,(int)u.uy);
    break;
  case 7:
    pline("The water moves as though of its own will!");
    if (((mvitals[0xa2].mvflags & 3) != 0) ||
       (pmVar5 = makemon(mons + 0xa2,level,(int)u.ux,(int)u.uy,0), pmVar5 == (monst *)0x0)) {
      pline("But it quiets down.");
    }
    break;
  case 8:
    pline("Yuk, this water tastes awful.");
    more_experienced(1,1,0);
    newexplevel();
    break;
  case 9:
    pline("Gaggg... this tastes like sewage!  You vomit.");
    sVar1 = acurr(4);
    iVar3 = rn2(0x1e - sVar1);
    morehungry(iVar3 + 0xb);
    vomit();
    break;
  case 10:
    pline("This water contains toxic wastes!");
    if ((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) {
      pline("You undergo a freakish metamorphosis!");
      polyself('\0');
    }
    break;
  case 0xb:
    You_hear("clanking from the pipes...");
    break;
  case 0xc:
    You_hear("snatches of song from among the sewers...");
    break;
  case 0x13:
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))) {
      pline("From the murky drain, a hand reaches up... --oops--");
      return;
    }
  default:
    iVar3 = rn2(3);
    if (iVar3 == 0) {
      local_48 = "hot";
    }
    else {
      iVar3 = rn2(2);
      local_48 = "warm";
      if (iVar3 != 0) {
        local_48 = "cold";
      }
    }
    pline("You take a sip of %s water.",local_48);
  }
  return;
}

Assistant:

void drinksink(void)
{
	struct obj *otmp;
	struct monst *mtmp;

	if (Levitation) {
		floating_above("sink");
		return;
	}
	switch(rn2(20)) {
		case 0: pline("You take a sip of very cold water.");
			break;
		case 1: pline("You take a sip of very warm water.");
			break;
		case 2: pline("You take a sip of scalding hot water.");
			if (FFire_resistance) {
				pline("It seems quite tasty.");
			} else {
				losehp(rnd(PFire_resistance ? 3 : 6),
				       "sipping boiling water", KILLED_BY);
			}
			break;
		case 3: if (mvitals[PM_SEWER_RAT].mvflags & G_GONE)
				pline("The sink seems quite dirty.");
			else {
				mtmp = makemon(&mons[PM_SEWER_RAT], level,
						u.ux, u.uy, NO_MM_FLAGS);
				if (mtmp) pline("Eek!  There's %s in the sink!",
					(Blind || !canspotmon(level, mtmp)) ?
					"something squirmy" :
					a_monnam(mtmp));
			}
			break;
		case 4: do {
				otmp = mkobj(level, POTION_CLASS,FALSE);
				if (otmp->otyp == POT_WATER) {
					obfree(otmp, NULL);
					otmp = NULL;
				}
			} while (!otmp);
			otmp->cursed = otmp->blessed = 0;
			pline("Some %s liquid flows from the faucet.",
			      Blind ? "odd" :
			      hcolor(OBJ_DESCR(objects[otmp->otyp])));
			otmp->dknown = !(Blind || Hallucination);
			otmp->quan++; /* Avoid panic upon useup() */
			otmp->fromsink = 1; /* kludge for docall() */
			dopotion(otmp);
			obfree(otmp, NULL);
			break;
		case 5: if (!(level->locations[u.ux][u.uy].looted & S_LRING)) {
			    pline("You find a ring in the sink!");
			    mkobj_at(RING_CLASS, level, u.ux, u.uy, TRUE);
			    level->locations[u.ux][u.uy].looted |= S_LRING;
			    exercise(A_WIS, TRUE);
			    newsym(u.ux,u.uy);
			} else pline("Some dirty water backs up in the drain.");
			break;
		case 6: breaksink(u.ux,u.uy);
			break;
		case 7: pline("The water moves as though of its own will!");
			if ((mvitals[PM_WATER_ELEMENTAL].mvflags & G_GONE)
			    || !makemon(&mons[PM_WATER_ELEMENTAL], level,
					u.ux, u.uy, NO_MM_FLAGS))
				pline("But it quiets down.");
			break;
		case 8: pline("Yuk, this water tastes awful.");
			more_experienced(1, 1, 0);
			newexplevel();
			break;
		case 9: pline("Gaggg... this tastes like sewage!  You vomit.");
			morehungry(rn1(30-ACURR(A_CON), 11));
			vomit();
			break;
		case 10: pline("This water contains toxic wastes!");
			if (!Unchanging) {
				pline("You undergo a freakish metamorphosis!");
				polyself(FALSE);
			}
			break;
		/* more odd messages --JJB */
		case 11: You_hear("clanking from the pipes...");
			break;
		case 12: You_hear("snatches of song from among the sewers...");
			break;
		case 19: if (Hallucination) {
		   pline("From the murky drain, a hand reaches up... --oops--");
				break;
			}
		default: pline("You take a sip of %s water.",
			rn2(3) ? (rn2(2) ? "cold" : "warm") : "hot");
	}
}